

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void parlist(LexState *ls)

{
  FuncState *fs_00;
  Proto *pPVar1;
  int iVar2;
  TString *name;
  bool bVar3;
  int local_24;
  int nparams;
  Proto *f;
  FuncState *fs;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pPVar1 = fs_00->f;
  local_24 = 0;
  pPVar1->is_vararg = '\0';
  if ((ls->t).token != 0x29) {
    do {
      iVar2 = (ls->t).token;
      if (iVar2 == 0x119) {
        luaX_next(ls);
        pPVar1->is_vararg = '\x01';
      }
      else {
        if (iVar2 != 0x124) {
          luaX_syntaxerror(ls,"<name> or \'...\' expected");
        }
        name = str_checkname(ls);
        new_localvar(ls,name);
        local_24 = local_24 + 1;
      }
      bVar3 = false;
      if (pPVar1->is_vararg == '\0') {
        iVar2 = testnext(ls,0x2c);
        bVar3 = iVar2 != 0;
      }
    } while (bVar3);
  }
  adjustlocalvars(ls,local_24);
  pPVar1->numparams = fs_00->nactvar;
  luaK_reserveregs(fs_00,(uint)fs_00->nactvar);
  return;
}

Assistant:

static void parlist (LexState *ls) {
  /* parlist -> [ param { ',' param } ] */
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  int nparams = 0;
  int isvararg = 0;
  if (ls->t.token != ')') {  /* is 'parlist' not empty? */
    do {
      switch (ls->t.token) {
        case TK_NAME: {  /* param -> NAME */
          new_localvar(ls, str_checkname(ls));
          nparams++;
          break;
        }
        case TK_DOTS: {  /* param -> '...' */
          luaX_next(ls);
          isvararg = 1;
          break;
        }
        default: luaX_syntaxerror(ls, "<name> or '...' expected");
      }
    } while (!isvararg && testnext(ls, ','));
  }
  adjustlocalvars(ls, nparams);
  f->numparams = cast_byte(fs->nactvar);
  if (isvararg)
    setvararg(fs, f->numparams);  /* declared vararg */
  luaK_reserveregs(fs, fs->nactvar);  /* reserve registers for parameters */
}